

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O2

void __thiscall
duckdb::DbpEncoder::WriteValueInternal(DbpEncoder *this,WriteStream *writer,int64_t *value)

{
  bitpacking_width_t *pbVar1;
  data_t *dst;
  idx_t iVar2;
  bitpacking_width_t bVar3;
  long lVar4;
  int64_t *piVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t iVar9;
  int64_t *src;
  
  lVar6 = *value - this->previous_value;
  this->previous_value = *value;
  lVar4 = this->min_delta;
  if (lVar6 <= this->min_delta) {
    lVar4 = lVar6;
  }
  this->min_delta = lVar4;
  iVar2 = this->block_count;
  this->block_count = iVar2 + 1;
  this->data[iVar2] = lVar6;
  if (this->block_count != 0x800) {
    return;
  }
  uVar8 = this->block_count + 0xff >> 8;
  src = this->data;
  lVar4 = 0;
  piVar5 = src;
  for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
      if ((ulong)(lVar4 + lVar6) < this->block_count) {
        iVar9 = piVar5[lVar6] - this->min_delta;
      }
      else {
        iVar9 = 0;
      }
      piVar5[lVar6] = iVar9;
    }
    lVar4 = lVar4 + 0x100;
    piVar5 = piVar5 + 0x100;
  }
  pbVar1 = this->list_of_bitwidths_of_miniblocks;
  piVar5 = src;
  for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
    if (uVar7 < uVar8) {
      bVar3 = BitpackingPrimitives::FindMinimumBitWidth<unsigned_long,false,false>
                        ((unsigned_long *)piVar5,0x100);
    }
    else {
      bVar3 = '\0';
    }
    pbVar1[uVar7] = bVar3;
    piVar5 = piVar5 + 0x100;
  }
  ParquetDecodeUtils::VarintEncode<unsigned_long>
            (this->min_delta >> 0x3f ^ this->min_delta * 2,writer);
  (**writer->_vptr_WriteStream)(writer,pbVar1,8);
  dst = this->data_packed;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    switchD_0049f7f1::default(dst,0,0x800);
    BitpackingPrimitives::PackBuffer<unsigned_long,true>
              (dst,(unsigned_long *)src,0x100,pbVar1[uVar7]);
    (**writer->_vptr_WriteStream)(writer,dst,(ulong)pbVar1[uVar7] << 5);
    src = src + 0x100;
  }
  this->count = this->count + this->block_count;
  this->min_delta = 0x7fffffffffffffff;
  this->block_count = 0;
  return;
}

Assistant:

void WriteValueInternal(WriteStream &writer, const int64_t &value) {
		// 1. Compute the differences between consecutive elements. For the first element in the block,
		// use the last element in the previous block or, in the case of the first block,
		// use the first value of the whole sequence, stored in the header.

		// Subtractions in steps 1) and 2) may incur signed arithmetic overflow,
		// and so will the corresponding additions when decoding.
		// Overflow should be allowed and handled as wrapping around in 2’s complement notation
		// so that the original values are correctly restituted.
		// This may require explicit care in some programming languages
		// (for example by doing all arithmetic in the unsigned domain).
		const auto delta = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(previous_value));
		previous_value = value;
		// Compute the frame of reference (the minimum of the deltas in the block).
		min_delta = MinValue(min_delta, delta);
		// append. if block is full, write it out
		data[block_count++] = delta;
		if (block_count == BLOCK_SIZE_IN_VALUES) {
			WriteBlock(writer);
		}
	}